

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall chrono::ChLoadBase::Update(ChLoadBase *this,double time)

{
  int iVar1;
  ChLoadJacobians *pCVar2;
  ChStateDelta mstate_w;
  ChState mstate_x;
  ChStateDelta local_b8;
  ChState local_a0;
  Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> local_88 [40];
  Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> local_60 [40];
  Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> local_38 [40];
  
  iVar1 = (*(this->super_ChObj)._vptr_ChObj[6])();
  ChState::ChState(&local_a0,(long)iVar1,(ChIntegrable *)0x0);
  (*(this->super_ChObj)._vptr_ChObj[8])(this,&local_a0);
  iVar1 = (*(this->super_ChObj)._vptr_ChObj[7])(this);
  ChStateDelta::ChStateDelta(&local_b8,(long)iVar1,(ChIntegrable *)0x0);
  (*(this->super_ChObj)._vptr_ChObj[9])(this,&local_b8);
  (*(this->super_ChObj)._vptr_ChObj[0xc])(this,&local_a0,&local_b8);
  iVar1 = (*(this->super_ChObj)._vptr_ChObj[0x10])(this);
  if ((char)iVar1 != '\0') {
    pCVar2 = this->jacobians;
    if (pCVar2 == (ChLoadJacobians *)0x0) {
      (*(this->super_ChObj)._vptr_ChObj[0xe])(this);
      pCVar2 = this->jacobians;
    }
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (local_38,&(pCVar2->K).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (local_60,&(this->jacobians->R).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (local_88,&(this->jacobians->M).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (type *)0x0);
    (*(this->super_ChObj)._vptr_ChObj[0xd])(this,&local_a0,&local_b8,local_38,local_60,local_88);
  }
  Eigen::internal::handmade_aligned_free
            (local_b8.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_a0.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChLoadBase::Update(double time) {
    // current state speed & position
    ChState mstate_x(LoadGet_ndof_x(), 0);
    LoadGetStateBlock_x(mstate_x);
    ChStateDelta mstate_w(LoadGet_ndof_w(), 0);
    LoadGetStateBlock_w(mstate_w);
    // compute the applied load, at current state
    ComputeQ(&mstate_x, &mstate_w);
    // compute the jacobian, at current state
    if (IsStiff()) {
        if (!jacobians)
            CreateJacobianMatrices();
        ComputeJacobian(&mstate_x, &mstate_w, jacobians->K, jacobians->R, jacobians->M);
    }
}